

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

int udp_ep_get_locaddr(void *arg,void *v,size_t *szp,nni_opt_type t)

{
  int iVar1;
  undefined1 local_c0 [8];
  nng_sockaddr sa;
  void *pvStack_30;
  int rv;
  udp_ep *ep;
  size_t *psStack_20;
  nni_opt_type t_local;
  size_t *szp_local;
  void *v_local;
  void *arg_local;
  
  pvStack_30 = arg;
  ep._4_4_ = t;
  psStack_20 = szp;
  szp_local = (size_t *)v;
  v_local = arg;
  if (*arg == 0) {
    memcpy(local_c0,(void *)((long)arg + 0x858),0x88);
  }
  else {
    nni_plat_udp_sockname(*arg,(nni_sockaddr *)local_c0);
  }
  iVar1 = nni_copyout_sockaddr((nng_sockaddr *)local_c0,szp_local,psStack_20,ep._4_4_);
  return iVar1;
}

Assistant:

static int
udp_ep_get_locaddr(void *arg, void *v, size_t *szp, nni_opt_type t)
{
	udp_ep      *ep = arg;
	int          rv;
	nng_sockaddr sa;

	if (ep->udp != NULL) {
		(void) nni_udp_sockname(ep->udp, &sa);
	} else {
		sa = ep->self_sa;
	}

	rv = nni_copyout_sockaddr(&sa, v, szp, t);
	return (rv);
}